

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaPValAttrNodeValue
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaBasicItemPtr ownerItem,xmlAttrPtr attr,
              xmlChar *value,xmlSchemaTypePtr type)

{
  int iVar1;
  xmlParserErrors local_3c;
  int ret;
  xmlSchemaTypePtr type_local;
  xmlChar *value_local;
  xmlAttrPtr attr_local;
  xmlSchemaBasicItemPtr ownerItem_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  if (((pctxt == (xmlSchemaParserCtxtPtr)0x0) || (type == (xmlSchemaTypePtr)0x0)) ||
     (attr == (xmlAttrPtr)0x0)) {
    pctxt_local._4_4_ = ~XML_ERR_OK;
  }
  else if (type->type == XML_SCHEMA_TYPE_BASIC) {
    iVar1 = type->builtInType;
    if (((iVar1 - 0x10U < 2) || (iVar1 - 0x15U < 2)) || (iVar1 == 0x1d)) {
      local_3c = xmlSchemaValPredefTypeNode(type,value,(xmlSchemaValPtr *)0x0,(xmlNodePtr)attr);
      if ((int)local_3c < 0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaPValAttrNodeValue",
                   "failed to validate a schema attribute value");
        pctxt_local._4_4_ = ~XML_ERR_OK;
      }
      else {
        if (0 < (int)local_3c) {
          if ((type->flags & 0x40U) == 0) {
            local_3c = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
          }
          else {
            local_3c = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
          }
          xmlSchemaPSimpleTypeErr
                    (pctxt,local_3c,ownerItem,(xmlNodePtr)attr,type,(char *)0x0,value,(char *)0x0,
                     (xmlChar *)0x0,(xmlChar *)0x0);
        }
        pctxt_local._4_4_ = local_3c;
      }
    }
    else {
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaPValAttrNodeValue",
                 "validation using the given type is not supported while parsing a schema");
      pctxt_local._4_4_ = ~XML_ERR_OK;
    }
  }
  else {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaPValAttrNodeValue",
               "the given type is not a built-in type");
    pctxt_local._4_4_ = ~XML_ERR_OK;
  }
  return pctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaPValAttrNodeValue(xmlSchemaParserCtxtPtr pctxt,
			   xmlSchemaBasicItemPtr ownerItem,
			   xmlAttrPtr attr,
			   const xmlChar *value,
			   xmlSchemaTypePtr type)
{

    int ret = 0;

    /*
    * NOTE: Should we move this to xmlschematypes.c? Hmm, but this
    * one is really meant to be used internally, so better not.
    */
    if ((pctxt == NULL) || (type == NULL) || (attr == NULL))
	return (-1);
    if (type->type != XML_SCHEMA_TYPE_BASIC) {
	PERROR_INT("xmlSchemaPValAttrNodeValue",
	    "the given type is not a built-in type");
	return (-1);
    }
    switch (type->builtInType) {
	case XML_SCHEMAS_NCNAME:
	case XML_SCHEMAS_QNAME:
	case XML_SCHEMAS_ANYURI:
	case XML_SCHEMAS_TOKEN:
	case XML_SCHEMAS_LANGUAGE:
	    ret = xmlSchemaValPredefTypeNode(type, value, NULL,
		(xmlNodePtr) attr);
	    break;
	default: {
	    PERROR_INT("xmlSchemaPValAttrNodeValue",
		"validation using the given type is not supported while "
		"parsing a schema");
	    return (-1);
	}
    }
    /*
    * TODO: Should we use the S4S error codes instead?
    */
    if (ret < 0) {
	PERROR_INT("xmlSchemaPValAttrNodeValue",
	    "failed to validate a schema attribute value");
	return (-1);
    } else if (ret > 0) {
	if (WXS_IS_LIST(type))
	    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	else
	    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	xmlSchemaPSimpleTypeErr(pctxt,
	    ret, ownerItem, (xmlNodePtr) attr,
	    type, NULL, value, NULL, NULL, NULL);
    }
    return (ret);
}